

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::piece_picker::inc_refcount
          (piece_picker *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask,torrent_peer *peer)

{
  piece_index_t index;
  prio_index_t elem_index;
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar6;
  uint *puVar7;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar8;
  _Head_base<0UL,_unsigned_int_*,_false> _Var9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  piece_pos *this_00;
  const_iterator cVar15;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> asStack_58 [2];
  undefined1 local_50 [8];
  alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  incremented_destructor;
  
  psVar8 = asStack_58;
  bVar2 = bitfield::none_set(&bitmask->super_bitfield);
  if (bVar2) {
    return;
  }
  bVar2 = bitfield::all_set(&bitmask->super_bitfield);
  _Var9._M_head_impl =
       *(uint **)&(bitmask->super_bitfield).m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if (bVar2) {
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var9._M_head_impl ==
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = *_Var9._M_head_impl;
    }
    if (uVar12 == (uint)((ulong)((long)(this->m_piece_map).
                                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                       .
                                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_piece_map).
                                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      .
                                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      iVar3 = this->m_seeds;
      this->m_seeds = iVar3 + 1;
      if (iVar3 != 0) {
        return;
      }
      this->m_dirty = true;
      return;
    }
  }
  if (_Var9._M_head_impl == (uint *)0x0) {
    iVar3 = 0;
LAB_0025f312:
    incremented_destructor.objects.m_ptr =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
    psVar6 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
  }
  else {
    uVar14 = (long)(int)*_Var9._M_head_impl / 2;
    uVar5 = 0x32;
    if ((int)uVar14 < 0x32) {
      uVar5 = uVar14;
    }
    incremented_destructor.objects.m_ptr =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)(uVar5 & 0xffffffff);
    iVar3 = (int)uVar5;
    if ((int)*_Var9._M_head_impl < 2) goto LAB_0025f312;
    psVar6 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
             ((long)asStack_58 - (ulong)(iVar3 * 4 + 0xfU & 0xfffffff0));
    psVar8 = psVar6;
  }
  local_50 = (undefined1  [8])psVar6;
  if (this->m_dirty == false) {
    puVar7 = _Var9._M_head_impl + 1;
    if (_Var9._M_head_impl == (uint *)0x0) {
      puVar7 = (uint *)0x0;
    }
    *(undefined8 *)(psVar8 + -2) = 0x25f342;
    cVar15 = bitfield::end(&bitmask->super_bitfield);
    iVar4 = 0;
    uVar12 = 0x80000000;
    uVar13 = 0;
    while (uVar12 != cVar15.bit || puVar7 != cVar15.buf) {
      if ((*puVar7 &
          (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)) !=
          0) {
        if ((int)uVar13 < iVar3) {
          psVar6[(int)uVar13].m_val = iVar4;
        }
        uVar13 = uVar13 + 1;
        if (iVar3 <= (int)uVar13) break;
      }
      bVar2 = uVar12 == 1;
      puVar7 = puVar7 + bVar2;
      uVar12 = uVar12 >> 1;
      if (bVar2) {
        uVar12 = 0x80000000;
      }
      iVar4 = iVar4 + 1;
    }
    if ((int)uVar13 < iVar3) {
      uVar5 = 0;
      uVar14 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        uVar14 = uVar5;
      }
      while (uVar14 != uVar5) {
        index.m_val = psVar6[uVar5].m_val;
        this_00 = (this->m_piece_map).
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  .
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start + index.m_val;
        incremented_destructor.objects.m_len = uVar5;
        *(undefined8 *)(psVar8 + -2) = 0x25f3e7;
        iVar3 = piece_pos::priority(this_00,this);
        *(uint *)this_00 = *(uint *)this_00 & 0xfc000000 | *(uint *)this_00 + 1 & 0x3ffffff;
        *(undefined8 *)(psVar8 + -2) = 0x25f40e;
        iVar4 = piece_pos::priority(this_00,this);
        if (iVar3 != iVar4) {
          if (iVar3 < 0) {
            *(undefined8 *)(psVar8 + -2) = 0x25f434;
            add(this,index);
          }
          else {
            elem_index.m_val = (this_00->index).m_val;
            *(undefined8 *)(psVar8 + -2) = 0x25f427;
            update(this,iVar3,elem_index);
          }
        }
        uVar5 = incremented_destructor.objects.m_len + 1;
      }
      goto LAB_0025f4e6;
    }
    _Var9._M_head_impl =
         *(uint **)&(bitmask->super_bitfield).m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  }
  puVar7 = _Var9._M_head_impl + 4;
  if (_Var9._M_head_impl == (uint *)0x0) {
    puVar7 = (uint *)0x0;
  }
  *(undefined8 *)(psVar8 + -2) = 0x25f459;
  cVar15 = bitfield::end(&bitmask->super_bitfield);
  lVar10 = 0;
  uVar12 = 0x80000000;
  bVar11 = 0;
  while (uVar12 != cVar15.bit || puVar7 != cVar15.buf) {
    if ((*puVar7 &
        (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)) != 0)
    {
      ppVar1 = (this->m_piece_map).
               super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               .
               super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(uint *)((long)&ppVar1->field_0x0 + lVar10);
      *(uint *)((long)&ppVar1->field_0x0 + lVar10) = uVar13 & 0xfc000000 | uVar13 + 1 & 0x3ffffff;
      bVar11 = 1;
    }
    bVar2 = uVar12 == 1;
    puVar7 = puVar7 + bVar2;
    uVar12 = uVar12 >> 1;
    if (bVar2) {
      uVar12 = 0x80000000;
    }
    lVar10 = lVar10 + 8;
  }
  if (((~bVar11 | this->m_dirty) & 1) == 0) {
    this->m_dirty = true;
  }
LAB_0025f4e6:
  *(undefined8 *)(psVar8 + -2) = 0x25f4ef;
  alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  ~alloca_destructor((alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                      *)local_50);
  return;
}

Assistant:

void piece_picker::inc_refcount(typed_bitfield<piece_index_t> const& bitmask
		, const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "inc_refcount(bitfield)" << std::endl;
#endif

		// nothing set, nothing to do here
		if (bitmask.none_set()) return;

		if (bitmask.all_set() && bitmask.size() == int(m_piece_map.size()))
		{
			inc_refcount_all(peer);
			return;
		}

		int const size = std::min(50, int(bitmask.size() / 2));

		// this is an optimization where if just a few
		// pieces end up changing, instead of making
		// the piece list dirty, just update those pieces
		// instead
		TORRENT_ALLOCA(incremented, piece_index_t, size);

		if (!m_dirty)
		{
			// first count how many pieces we're updating. If it's few (less than half)
			// we'll just update them one at a time. Otherwise we'll just update the counters
			// and mark the picker as dirty, so we'll rebuild it next time we need it.
			// this only matters if we're not already dirty, in which case the fasted
			// thing to do is to just update the counters and be done
			piece_index_t index{0};
			int num_inc = 0;
			for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
			{
				if (!*i) continue;
				if (num_inc < size) incremented[num_inc] = index;
				++num_inc;
				if (num_inc >= size) break;
			}

			if (num_inc < size)
			{
				// not that many pieces were updated
				// just update those individually instead of
				// rebuilding the whole piece list
				for (int i = 0; i < num_inc; ++i)
				{
					piece_index_t const piece = incremented[i];
					piece_pos& p = m_piece_map[piece];
					int prev_priority = p.priority(this);
					++p.peer_count;
#ifdef TORRENT_DEBUG_REFCOUNTS
					TORRENT_ASSERT(p.have_peers.count(peer) == 0);
					p.have_peers.insert(peer);
#else
					TORRENT_UNUSED(peer);
#endif
					int new_priority = p.priority(this);
					if (prev_priority == new_priority) continue;
					else if (prev_priority >= 0) update(prev_priority, p.index);
					else add(piece);
				}
				return;
			}
		}

		piece_index_t index{0};
		bool updated = false;
		for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
		{
			if (*i)
			{
#ifdef TORRENT_DEBUG_REFCOUNTS
				TORRENT_ASSERT(m_piece_map[index].have_peers.count(peer) == 0);
				m_piece_map[index].have_peers.insert(peer);
#else
				TORRENT_UNUSED(peer);
#endif

				++m_piece_map[index].peer_count;
				updated = true;
			}
		}

		// if we're already dirty, no point in doing anything more
		if (m_dirty) return;

		if (updated) m_dirty = true;
	}